

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextodfwriter.cpp
# Opt level: O2

void __thiscall
QTextOdfWriter::writeFrameFormat
          (QTextOdfWriter *this,QXmlStreamWriter *writer,QTextFrameFormat format,int formatIndex)

{
  char16_t *pcVar1;
  ulong uVar2;
  qreal qVar3;
  QAnyStringView QVar4;
  char16_t *pcVar5;
  bool bVar6;
  storage_type *psVar7;
  QSharedDataPointer<QTextFormatPrivate> this_00;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar8;
  size_t sVar9;
  long in_FS_OFFSET;
  undefined4 uVar10;
  undefined4 uVar11;
  QByteArrayView QVar12;
  QAnyStringView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QAnyStringView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QAnyStringView QVar19;
  QByteArrayView QVar20;
  QAnyStringView QVar21;
  QByteArrayView QVar22;
  QAnyStringView QVar23;
  QByteArrayView QVar24;
  QAnyStringView QVar25;
  QByteArrayView QVar26;
  QAnyStringView QVar27;
  QByteArrayView QVar28;
  QAnyStringView QVar29;
  QAnyStringView QVar30;
  QAnyStringView QVar31;
  QAnyStringView QVar32;
  QAnyStringView QVar33;
  QAnyStringView QVar34;
  QAnyStringView QVar35;
  QAnyStringView QVar36;
  QAnyStringView QVar37;
  QAnyStringView QVar38;
  QAnyStringView QVar39;
  QAnyStringView QVar40;
  QAnyStringView QVar41;
  QAnyStringView QVar42;
  QArrayDataPointer<char16_t> local_90;
  QArrayDataPointer<char16_t> local_78;
  char16_t *local_60;
  ulong uStack_58;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  this_00 = format.super_QTextFormat.d.d.ptr;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = (this->styleNS).d.ptr;
  uVar2 = (this->styleNS).d.size;
  psVar7 = (storage_type *)QByteArrayView::lengthHelperCharArray("style",6);
  QVar12.m_data = psVar7;
  QVar12.m_size = (qsizetype)&local_50;
  QString::fromLatin1(QVar12);
  QVar13.m_size = (size_t)pcVar1;
  QVar13.field_0.m_data_utf8 = (char *)writer;
  QVar29.m_size = (size_t)local_50.ptr;
  QVar29.field_0.m_data = (void *)(uVar2 | 0x8000000000000000);
  QXmlStreamWriter::writeStartElement(QVar13,QVar29);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  pcVar1 = (this->styleNS).d.ptr;
  uVar2 = (this->styleNS).d.size;
  psVar7 = (storage_type *)QByteArrayView::lengthHelperCharArray("name",5);
  QVar14.m_data = psVar7;
  QVar14.m_size = (qsizetype)&local_50;
  QString::fromLatin1(QVar14);
  pcVar5 = local_50.ptr;
  aVar8.m_data = (void *)(local_50.size | 0x8000000000000000);
  psVar7 = (storage_type *)QByteArrayView::lengthHelperCharArray("s%1",4);
  QVar15.m_data = psVar7;
  QVar15.m_size = (qsizetype)&local_90;
  QString::fromLatin1(QVar15);
  sVar9 = 0x20;
  QString::arg<int,_true>
            ((QString *)&local_78,(QString *)&local_90,format.super_QTextFormat.format_type,0,10,
             (QChar)0x20);
  local_60 = local_78.ptr;
  uStack_58 = local_78.size | 0x8000000000000000;
  QVar16.m_size = (size_t)pcVar1;
  QVar16.field_0.m_data_utf8 = (char *)writer;
  QVar30.m_size = (size_t)pcVar5;
  QVar30.field_0.m_data = (void *)(uVar2 | 0x8000000000000000);
  QVar37.m_size = sVar9;
  QVar37.field_0.m_data = aVar8.m_data;
  QXmlStreamWriter::writeAttribute(QVar16,QVar30,QVar37);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  pcVar1 = (this->styleNS).d.ptr;
  uVar2 = (this->styleNS).d.size;
  psVar7 = (storage_type *)QByteArrayView::lengthHelperCharArray("family",7);
  QVar17.m_data = psVar7;
  QVar17.m_size = (qsizetype)&local_50;
  QString::fromLatin1(QVar17);
  pcVar5 = local_50.ptr;
  aVar8.m_data = (void *)(local_50.size | 0x8000000000000000);
  psVar7 = (storage_type *)QByteArrayView::lengthHelperCharArray("section",8);
  QVar18.m_data = psVar7;
  QVar18.m_size = (qsizetype)&local_78;
  QString::fromLatin1(QVar18);
  QVar19.m_size = (size_t)pcVar1;
  QVar19.field_0.m_data_utf8 = (char *)writer;
  QVar31.m_size = (size_t)pcVar5;
  QVar31.field_0.m_data = (void *)(uVar2 | 0x8000000000000000);
  QVar38.m_size = sVar9;
  QVar38.field_0.m_data = aVar8.m_data;
  QXmlStreamWriter::writeAttribute(QVar19,QVar31,QVar38);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  pcVar1 = (this->styleNS).d.ptr;
  uVar2 = (this->styleNS).d.size;
  psVar7 = (storage_type *)QByteArrayView::lengthHelperCharArray("section-properties",0x13);
  QVar20.m_data = psVar7;
  QVar20.m_size = (qsizetype)&local_50;
  QString::fromLatin1(QVar20);
  QVar21.m_size = (size_t)pcVar1;
  QVar21.field_0.m_data_utf8 = (char *)writer;
  QVar32.m_size = (size_t)local_50.ptr;
  QVar32.field_0.m_data = (void *)(uVar2 | 0x8000000000000000);
  QXmlStreamWriter::writeEmptyElement(QVar21,QVar32);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  bVar6 = QTextFormat::hasProperty((QTextFormat *)this_00.d.ptr,0x4005);
  if (bVar6) {
    pcVar1 = (this->foNS).d.ptr;
    uVar2 = (this->foNS).d.size;
    psVar7 = (storage_type *)QByteArrayView::lengthHelperCharArray("margin-top",0xb);
    QVar22.m_data = psVar7;
    QVar22.m_size = (qsizetype)&local_50;
    QString::fromLatin1(QVar22);
    pcVar5 = local_50.ptr;
    aVar8.m_data = (void *)(local_50.size | 0x8000000000000000);
    qVar3 = QTextFrameFormat::topMargin((QTextFrameFormat *)this_00.d.ptr);
    uVar10 = SUB84(qVar3,0);
    uVar11 = (undefined4)((ulong)qVar3 >> 0x20);
    if (qVar3 <= 0.0) {
      uVar10 = 0;
      uVar11 = 0;
    }
    pixelToPoint((QString *)&local_78,(qreal)CONCAT44(uVar11,uVar10));
    QVar23.m_size = (size_t)pcVar1;
    QVar23.field_0.m_data_utf8 = (char *)writer;
    QVar33.m_size = (size_t)pcVar5;
    QVar33.field_0.m_data = (void *)(uVar2 | 0x8000000000000000);
    QVar39.m_size = sVar9;
    QVar39.field_0.m_data = aVar8.m_data;
    QXmlStreamWriter::writeAttribute(QVar23,QVar33,QVar39);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  bVar6 = QTextFormat::hasProperty((QTextFormat *)this_00.d.ptr,0x4006);
  if (bVar6) {
    pcVar1 = (this->foNS).d.ptr;
    uVar2 = (this->foNS).d.size;
    psVar7 = (storage_type *)QByteArrayView::lengthHelperCharArray("margin-bottom",0xe);
    QVar24.m_data = psVar7;
    QVar24.m_size = (qsizetype)&local_50;
    QString::fromLatin1(QVar24);
    pcVar5 = local_50.ptr;
    aVar8.m_data = (void *)(local_50.size | 0x8000000000000000);
    qVar3 = QTextFrameFormat::bottomMargin((QTextFrameFormat *)this_00.d.ptr);
    uVar10 = SUB84(qVar3,0);
    uVar11 = (undefined4)((ulong)qVar3 >> 0x20);
    if (qVar3 <= 0.0) {
      uVar10 = 0;
      uVar11 = 0;
    }
    pixelToPoint((QString *)&local_78,(qreal)CONCAT44(uVar11,uVar10));
    QVar25.m_size = (size_t)pcVar1;
    QVar25.field_0.m_data_utf8 = (char *)writer;
    QVar34.m_size = (size_t)pcVar5;
    QVar34.field_0.m_data = (void *)(uVar2 | 0x8000000000000000);
    QVar40.m_size = sVar9;
    QVar40.field_0.m_data = aVar8.m_data;
    QXmlStreamWriter::writeAttribute(QVar25,QVar34,QVar40);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  bVar6 = QTextFormat::hasProperty((QTextFormat *)this_00.d.ptr,0x4007);
  if (bVar6) {
    pcVar1 = (this->foNS).d.ptr;
    uVar2 = (this->foNS).d.size;
    psVar7 = (storage_type *)QByteArrayView::lengthHelperCharArray("margin-left",0xc);
    QVar26.m_data = psVar7;
    QVar26.m_size = (qsizetype)&local_50;
    QString::fromLatin1(QVar26);
    pcVar5 = local_50.ptr;
    aVar8.m_data = (void *)(local_50.size | 0x8000000000000000);
    qVar3 = QTextFrameFormat::leftMargin((QTextFrameFormat *)this_00.d.ptr);
    uVar10 = SUB84(qVar3,0);
    uVar11 = (undefined4)((ulong)qVar3 >> 0x20);
    if (qVar3 <= 0.0) {
      uVar10 = 0;
      uVar11 = 0;
    }
    pixelToPoint((QString *)&local_78,(qreal)CONCAT44(uVar11,uVar10));
    QVar27.m_size = (size_t)pcVar1;
    QVar27.field_0.m_data_utf8 = (char *)writer;
    QVar35.m_size = (size_t)pcVar5;
    QVar35.field_0.m_data = (void *)(uVar2 | 0x8000000000000000);
    QVar41.m_size = sVar9;
    QVar41.field_0.m_data = aVar8.m_data;
    QXmlStreamWriter::writeAttribute(QVar27,QVar35,QVar41);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  bVar6 = QTextFormat::hasProperty((QTextFormat *)this_00.d.ptr,0x4008);
  if (bVar6) {
    pcVar1 = (this->foNS).d.ptr;
    uVar2 = (this->foNS).d.size;
    psVar7 = (storage_type *)QByteArrayView::lengthHelperCharArray("margin-right",0xd);
    QVar28.m_data = psVar7;
    QVar28.m_size = (qsizetype)&local_50;
    QString::fromLatin1(QVar28);
    qVar3 = QTextFrameFormat::rightMargin((QTextFrameFormat *)this_00.d.ptr);
    uVar10 = SUB84(qVar3,0);
    uVar11 = (undefined4)((ulong)qVar3 >> 0x20);
    if (qVar3 <= 0.0) {
      uVar10 = 0;
      uVar11 = 0;
    }
    pixelToPoint((QString *)&local_78,(qreal)CONCAT44(uVar11,uVar10));
    QVar4.m_size = (size_t)pcVar1;
    QVar4.field_0.m_data_utf8 = (char *)writer;
    QVar36.m_size = (size_t)local_50.ptr;
    QVar36.field_0.m_data = (void *)(uVar2 | 0x8000000000000000);
    QVar42.m_size = sVar9;
    QVar42.field_0.m_data = (void *)(local_50.size | 0x8000000000000000);
    QXmlStreamWriter::writeAttribute(QVar4,QVar36,QVar42);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextOdfWriter::writeFrameFormat(QXmlStreamWriter &writer, QTextFrameFormat format, int formatIndex) const
{
    writer.writeStartElement(styleNS, QString::fromLatin1("style"));
    writer.writeAttribute(styleNS, QString::fromLatin1("name"), QString::fromLatin1("s%1").arg(formatIndex));
    writer.writeAttribute(styleNS, QString::fromLatin1("family"), QString::fromLatin1("section"));
    writer.writeEmptyElement(styleNS, QString::fromLatin1("section-properties"));
    if (format.hasProperty(QTextFormat::FrameTopMargin))
        writer.writeAttribute(foNS, QString::fromLatin1("margin-top"), pixelToPoint(qMax(qreal(0.), format.topMargin())) );
    if (format.hasProperty(QTextFormat::FrameBottomMargin))
        writer.writeAttribute(foNS, QString::fromLatin1("margin-bottom"), pixelToPoint(qMax(qreal(0.), format.bottomMargin())) );
    if (format.hasProperty(QTextFormat::FrameLeftMargin))
        writer.writeAttribute(foNS, QString::fromLatin1("margin-left"), pixelToPoint(qMax(qreal(0.), format.leftMargin())) );
    if (format.hasProperty(QTextFormat::FrameRightMargin))
        writer.writeAttribute(foNS, QString::fromLatin1("margin-right"), pixelToPoint(qMax(qreal(0.), format.rightMargin())) );

    writer.writeEndElement(); // style

// TODO consider putting the following properties in a qt-namespace.
// Position   position () const
// qreal   border () const
// QBrush   borderBrush () const
// BorderStyle   borderStyle () const
// qreal   padding () const
// QTextLength   width () const
// QTextLength   height () const
// PageBreakFlags   pageBreakPolicy () const
}